

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_stats.hpp
# Opt level: O3

void __thiscall
so_5::disp::reuse::thread_pool_stats::data_source_t::collector_t::~collector_t(collector_t *this)

{
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t> *this_00;
  queue_description_holder_t *pqVar1;
  queue_description_holder_t *pqVar2;
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t> holder;
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t> current;
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t> local_40;
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t> local_38;
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t> local_30;
  
  this_00 = &this->m_queue_desc_head;
  (this->super_stats_consumer_t)._vptr_stats_consumer_t =
       (_func_int **)&PTR_set_thread_count_00288f00;
  pqVar1 = (this->m_queue_desc_head).m_obj;
  local_40.m_obj = pqVar1;
  if (pqVar1 == (queue_description_holder_t *)0x0) {
    intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::
    dismiss_object(this_00);
  }
  else {
    LOCK();
    (pqVar1->super_atomic_refcounted_t).m_ref_counter.super___atomic_base<unsigned_long>._M_i =
         (pqVar1->super_atomic_refcounted_t).m_ref_counter.super___atomic_base<unsigned_long>._M_i +
         1;
    UNLOCK();
    intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::
    dismiss_object(this_00);
    if (pqVar1 != (queue_description_holder_t *)0x0) {
      do {
        LOCK();
        (pqVar1->super_atomic_refcounted_t).m_ref_counter.super___atomic_base<unsigned_long>._M_i =
             (pqVar1->super_atomic_refcounted_t).m_ref_counter.super___atomic_base<unsigned_long>.
             _M_i + 1;
        UNLOCK();
        pqVar2 = ((local_40.m_obj)->m_next).m_obj;
        if (pqVar2 == (queue_description_holder_t *)0x0) {
          pqVar2 = (queue_description_holder_t *)0x0;
        }
        else {
          LOCK();
          (pqVar2->super_atomic_refcounted_t).m_ref_counter.super___atomic_base<unsigned_long>._M_i
               = (pqVar2->super_atomic_refcounted_t).m_ref_counter.
                 super___atomic_base<unsigned_long>._M_i + 1;
          UNLOCK();
        }
        local_38.m_obj = local_40.m_obj;
        local_40.m_obj = pqVar2;
        local_30.m_obj = pqVar1;
        intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::
        dismiss_object(&local_38);
        intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::
        dismiss_object(&(local_30.m_obj)->m_next);
        intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::
        dismiss_object(&local_30);
        pqVar1 = pqVar2;
      } while (pqVar2 != (queue_description_holder_t *)0x0);
    }
  }
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::dismiss_object
            (&this->m_queue_desc_tail);
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::dismiss_object
            (&local_40);
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::dismiss_object
            (&this->m_queue_desc_tail);
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::dismiss_object
            (this_00);
  return;
}

Assistant:

~collector_t()
					{
						// Chain of queue data sources must be cleaned up.
						auto holder = m_queue_desc_head;
						m_queue_desc_head.reset();

						while( holder )
							{
								auto current = holder;
								holder = holder->m_next;
								current->m_next.reset();
							}

						m_queue_desc_tail.reset();
					}